

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_history.cpp
# Opt level: O2

void __thiscall
NshHistoryAddEntry_SuccessOneElement_Test::NshHistoryAddEntry_SuccessOneElement_Test
          (NshHistoryAddEntry_SuccessOneElement_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00161d10;
  return;
}

Assistant:

TEST(NshHistoryAddEntry, SuccessOneElement)
{
    nsh_history_t hist;
    nsh_history_reset(&hist);

    const char new_entry[] = "new_entry";
    nsh_history_add_entry(&hist, new_entry);

    ASSERT_EQ(hist.size, 1);
    ASSERT_EQ(hist.head, 1);
    ASSERT_EQ(hist.tail, 0);
    ASSERT_STREQ(hist.entries[0], new_entry);
}